

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qopenglpixeltransferoptions.cpp
# Opt level: O0

void __thiscall
QOpenGLPixelTransferOptions::setAlignment(QOpenGLPixelTransferOptions *this,int alignment)

{
  QOpenGLPixelTransferOptionsData *pQVar1;
  int in_ESI;
  
  pQVar1 = QSharedDataPointer<QOpenGLPixelTransferOptionsData>::operator->
                     ((QSharedDataPointer<QOpenGLPixelTransferOptionsData> *)CONCAT44(in_ESI,in_ESI)
                     );
  pQVar1->alignment = in_ESI;
  return;
}

Assistant:

void QOpenGLPixelTransferOptions::setAlignment(int alignment)
{
    data->alignment = alignment;
}